

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O2

int clip_uhd_num_image_embeds_col(clip_ctx *ctx_clip)

{
  slice_instructions inst;
  slice_instructions local_40;
  
  llava_uhd::get_slice_instructions(&local_40,ctx_clip,&ctx_clip->load_image_size);
  std::_Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::
  ~_Vector_base(&local_40.slices.
                 super__Vector_base<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
               );
  return local_40.grid_size.width;
}

Assistant:

int clip_uhd_num_image_embeds_col(struct clip_ctx * ctx_clip) {
    const auto inst = llava_uhd::get_slice_instructions(ctx_clip, ctx_clip->load_image_size);
    return inst.grid_size.width;
}